

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

QSize __thiscall QMdi::ControllerWidget::sizeHint(ControllerWidget *this)

{
  QStyle *pQVar1;
  QSize QVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int buttonSize;
  QSize size;
  QStyleOptionComplex opt;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  ControllerWidget *this_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ControllerWidget *local_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::ensurePolished((QWidget *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  this_00 = (ControllerWidget *)&DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionComplex::QStyleOptionComplex
            ((QStyleOptionComplex *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffff5c,
             in_stack_ffffffffffffff58);
  initStyleOption(this_00,(QStyleOptionComplex *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  pQVar1 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  (**(code **)(*(long *)pQVar1 + 0xe0))(pQVar1,0x5c,&local_58,in_RDI);
  local_60 = this_00;
  QSize::QSize((QSize *)this_00,in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58);
  pQVar1 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  QVar2 = (QSize)(**(code **)(*(long *)pQVar1 + 0xe8))(pQVar1,0x15,&local_58,&local_60,in_RDI);
  QStyleOptionComplex::~QStyleOptionComplex((QStyleOptionComplex *)0x62b349);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSize ControllerWidget::sizeHint() const
{
    ensurePolished();
    QStyleOptionComplex opt;
    initStyleOption(&opt);
    const int buttonSize = style()->pixelMetric(QStyle::PM_TitleBarButtonSize, &opt, this);
    QSize size(3 * buttonSize, buttonSize);
    return style()->sizeFromContents(QStyle::CT_MdiControls, &opt, size, this);
}